

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

lhcell * lhNewCell(lhash_kv_engine *pEngine,lhpage *pPage)

{
  lhcell *plVar1;
  ulong uVar2;
  
  plVar1 = (lhcell *)SyMemBackendPoolAlloc(&pEngine->sAllocator,0x80);
  if (plVar1 == (lhcell *)0x0) {
    plVar1 = (lhcell *)0x0;
  }
  else {
    uVar2 = 0xfffffffffffffffc;
    do {
      *(undefined4 *)((long)&plVar1->nKey + uVar2) = 0;
      uVar2 = uVar2 + 4;
    } while (uVar2 < 0x7c);
    (plVar1->sKey).pBlob = (void *)0x0;
    (plVar1->sKey).nByte = 0;
    (plVar1->sKey).mByte = 0;
    (plVar1->sKey).pAllocator = &pEngine->sAllocator;
    (plVar1->sKey).nFlags = 0;
    plVar1->pPage = pPage;
  }
  return plVar1;
}

Assistant:

static lhcell * lhNewCell(lhash_kv_engine *pEngine,lhpage *pPage)
{
	lhcell *pCell;
	pCell = (lhcell *)SyMemBackendPoolAlloc(&pEngine->sAllocator,sizeof(lhcell));
	if( pCell == 0 ){
		return 0;
	}
	/* Zero the structure */
	SyZero(pCell,sizeof(lhcell));
	/* Fill in the structure */
	SyBlobInit(&pCell->sKey,&pEngine->sAllocator);
	pCell->pPage = pPage;
	return pCell;
}